

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmArgumentParser.h
# Opt level: O1

cmArgumentParser<void> * __thiscall
cmArgumentParser<void>::Bind
          (cmArgumentParser<void> *this,static_string_view name,
          function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
          *f,ExpectAtLeast expect)

{
  _Any_data local_70;
  _Manager_type local_60;
  _Any_data local_50;
  _Manager_type local_40;
  ExpectAtLeast local_30;
  
  std::
  function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::function((function<ArgumentParser::Continue_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)&local_50,f);
  local_30.Count = expect.Count;
  std::function<void(ArgumentParser::Instance&)>::
  function<cmArgumentParser<void>::Bind(cm::static_string_view,std::function<ArgumentParser::Continue(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)>,ArgumentParser::ExpectAtLeast)::_lambda(ArgumentParser::Instance&)_1_,void>
            ((function<void(ArgumentParser::Instance&)> *)local_70._M_pod_data,
             (anon_class_40_2_bca52434 *)&local_50);
  ArgumentParser::Base::Bind(&this->super_Base,name.super_string_view,(KeywordAction *)&local_70);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  return this;
}

Assistant:

cmArgumentParser& Bind(
    cm::static_string_view name,
    std::function<Continue(cm::string_view, cm::string_view)> f,
    ExpectAtLeast expect = { 1 })
  {
    this->Base::Bind(name, [f, expect](Instance& instance) {
      cm::string_view keyword = instance.Keyword;
      instance.Bind(
        [keyword, &f](cm::string_view arg) -> Continue {
          return f(keyword, arg);
        },
        expect);
    });
    return *this;
  }